

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDateTest.cpp
# Opt level: O0

int PDFDateTest(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  tm *ptVar6;
  time_t tVar7;
  string local_6c8 [4];
  int PDFTimezone_diff;
  string mytime;
  char strtime_buff [1024];
  int strtime_buffsize;
  int timezone_difference;
  tm *my_local_time;
  time_t time_utc;
  tm *my_utc_time;
  time_t time_local;
  undefined1 local_254 [8];
  PDFDate currentDate;
  string local_210;
  undefined1 local_1ec [8];
  PDFDate fullDate;
  string local_1a8;
  undefined1 local_184 [8];
  PDFDate localTimeDate;
  string local_140;
  undefined1 local_11c [8];
  PDFDate dayDate;
  string local_d8;
  undefined1 local_b4 [8];
  PDFDate yearDate;
  string local_60;
  undefined1 local_40 [8];
  PDFDate emptyDate;
  EStatusCode status;
  char **argv_local;
  int argc_local;
  
  emptyDate.HourFromUTC = 0;
  unique0x10000a41 = argv;
  PDFDate::PDFDate((PDFDate *)local_40);
  PDFDate::ToString_abi_cxx11_(&local_60,(PDFDate *)local_40);
  bVar1 = std::operator!=(&local_60,"");
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    emptyDate.HourFromUTC = -1;
    poVar4 = std::operator<<((ostream *)&std::cout,"wrong string conversion for empty date - ");
    PDFDate::ToString_abi_cxx11_((string *)&yearDate.HourFromUTC,(PDFDate *)local_40);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&yearDate.HourFromUTC);
  }
  PDFDate::PDFDate((PDFDate *)local_b4);
  local_b4._0_4_ = 0x7c0;
  PDFDate::ToString_abi_cxx11_(&local_d8,(PDFDate *)local_b4);
  bVar1 = std::operator!=(&local_d8,"D:1984");
  std::__cxx11::string::~string((string *)&local_d8);
  if (bVar1) {
    emptyDate.HourFromUTC = -1;
    poVar4 = std::operator<<((ostream *)&std::cout,"wrong string conversion for year date - ");
    PDFDate::ToString_abi_cxx11_((string *)&dayDate.HourFromUTC,(PDFDate *)local_b4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&dayDate.HourFromUTC);
  }
  PDFDate::PDFDate((PDFDate *)local_11c);
  local_11c._0_4_ = 0x7c0;
  local_11c._4_4_ = 4;
  dayDate.Year = 3;
  PDFDate::ToString_abi_cxx11_(&local_140,(PDFDate *)local_11c);
  bVar1 = std::operator!=(&local_140,"D:19840403");
  std::__cxx11::string::~string((string *)&local_140);
  if (bVar1) {
    emptyDate.HourFromUTC = -1;
    poVar4 = std::operator<<((ostream *)&std::cout,"wrong string conversion for day date - ");
    PDFDate::ToString_abi_cxx11_((string *)&localTimeDate.HourFromUTC,(PDFDate *)local_11c);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&localTimeDate.HourFromUTC);
  }
  PDFDate::PDFDate((PDFDate *)local_184);
  local_184._0_4_ = 0x7c0;
  local_184._4_4_ = 4;
  localTimeDate.Year = 3;
  localTimeDate.Month = 0x12;
  localTimeDate.Day = 0x1e;
  localTimeDate.Hour = 0x2d;
  PDFDate::ToString_abi_cxx11_(&local_1a8,(PDFDate *)local_184);
  bVar1 = std::operator!=(&local_1a8,"D:19840403183045");
  std::__cxx11::string::~string((string *)&local_1a8);
  if (bVar1) {
    emptyDate.HourFromUTC = -1;
    poVar4 = std::operator<<((ostream *)&std::cout,"wrong string conversion for local date - ");
    PDFDate::ToString_abi_cxx11_((string *)&fullDate.HourFromUTC,(PDFDate *)local_184);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&fullDate.HourFromUTC);
  }
  PDFDate::PDFDate((PDFDate *)local_1ec);
  local_1ec._0_4_ = 0x7c0;
  local_1ec._4_4_ = 4;
  fullDate.Year = 3;
  fullDate.Month = 0x12;
  fullDate.Day = 0x1e;
  fullDate.Hour = 0x2d;
  fullDate.Minute = 0;
  fullDate.Second = 2;
  fullDate.UTC = eEarlier;
  PDFDate::ToString_abi_cxx11_(&local_210,(PDFDate *)local_1ec);
  bVar1 = std::operator!=(&local_210,"D:19840403183045-02\'00\'");
  std::__cxx11::string::~string((string *)&local_210);
  if (bVar1) {
    emptyDate.HourFromUTC = -1;
    poVar4 = std::operator<<((ostream *)&std::cout,"wrong string conversion for full date - ");
    PDFDate::ToString_abi_cxx11_((string *)&currentDate.HourFromUTC,(PDFDate *)local_1ec);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&currentDate.HourFromUTC);
  }
  PDFDate::PDFDate((PDFDate *)local_254);
  PDFDate::SetToCurrentTime((PDFDate *)local_254);
  poVar4 = std::operator<<((ostream *)&std::cout,"Current time as represented in PDFDate - ");
  PDFDate::ToString_abi_cxx11_((string *)&time_local,(PDFDate *)local_254);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string((string *)&time_local);
  my_utc_time = (tm *)time((time_t *)0x0);
  ptVar6 = gmtime((time_t *)&my_utc_time);
  ptVar6->tm_isdst = -1;
  tVar7 = mktime(ptVar6);
  ptVar6 = localtime((time_t *)&my_utc_time);
  my_local_time._0_4_ = (int)tVar7;
  iVar2 = (int)my_utc_time - (int)my_local_time;
  std::__cxx11::string::string(local_6c8);
  strftime(mytime.field_2._M_local_buf + 8,0x400,"D:%Y%m%d%H%M%S",ptVar6);
  std::__cxx11::string::operator=(local_6c8,mytime.field_2._M_local_buf + 8);
  std::__cxx11::string::append((char *)local_6c8);
  sprintf(mytime.field_2._M_local_buf + 8,"%02d\'%02d\'");
  std::__cxx11::string::append((char *)local_6c8);
  poVar4 = std::operator<<((ostream *)&std::cout,"Current system time using time_t is    - ");
  poVar4 = std::operator<<(poVar4,local_6c8);
  std::operator<<(poVar4,"\n");
  if (iVar2 == 0) {
    std::operator<<((ostream *)&std::cout,
                    " --> timezone test skipped as it\'s utc, you should change your timezone and try again. \n"
                   );
  }
  else {
    iVar3 = 1;
    if (currentDate.Minute == 0) {
      iVar3 = -1;
    }
    iVar3 = iVar3 * (currentDate.Second * 0xe10 + currentDate.UTC * 0x3c);
    if (iVar3 != iVar2) {
      emptyDate.HourFromUTC = -1;
      poVar4 = std::operator<<((ostream *)&std::cout,"timezone does not match!\n");
      poVar4 = std::operator<<(poVar4," -> time_t    calculated: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4," (secs from UTC)\n");
      poVar4 = std::operator<<(poVar4," -> PDFHummus calculated: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4,"  (secs from UTC)\n");
    }
  }
  std::__cxx11::string::~string(local_6c8);
  bVar1 = emptyDate.HourFromUTC != 0;
  PDFDate::~PDFDate((PDFDate *)local_254);
  PDFDate::~PDFDate((PDFDate *)local_1ec);
  PDFDate::~PDFDate((PDFDate *)local_184);
  PDFDate::~PDFDate((PDFDate *)local_11c);
  PDFDate::~PDFDate((PDFDate *)local_b4);
  PDFDate::~PDFDate((PDFDate *)local_40);
  return (uint)bVar1;
}

Assistant:

int PDFDateTest(int argc, char* argv[])
{
	EStatusCode status = PDFHummus::eSuccess;

	// Empty Date
	PDFDate emptyDate;
	if(emptyDate.ToString() != "")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for empty date - "<<emptyDate.ToString().c_str()<<"\n";
	}

	// Year only Date
	PDFDate yearDate;
	yearDate.Year = 1984;
	if(yearDate.ToString() != "D:1984")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for year date - "<<yearDate.ToString().c_str()<<"\n";
	}

	// Day only Date
	PDFDate dayDate;
	dayDate.Year = 1984;
	dayDate.Month = 4;
	dayDate.Day = 3;
	if(dayDate.ToString() != "D:19840403")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for day date - "<<dayDate.ToString().c_str()<<"\n";
	}
	// local Time Date
	PDFDate localTimeDate;
	localTimeDate.Year = 1984;
	localTimeDate.Month = 4;
	localTimeDate.Day = 3;
	localTimeDate.Hour = 18;
	localTimeDate.Minute = 30;
	localTimeDate.Second = 45;
	if(localTimeDate.ToString() != "D:19840403183045")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for local date - "<<localTimeDate.ToString().c_str()<<"\n";
	}
	// Fully qualified Time date
	PDFDate fullDate;
	fullDate.Year = 1984;
	fullDate.Month = 4;
	fullDate.Day = 3;
	fullDate.Hour = 18;
	fullDate.Minute = 30;
	fullDate.Second = 45;
	fullDate.UTC = PDFDate::eEarlier;
	fullDate.HourFromUTC = 2;
	fullDate.MinuteFromUTC = 0;
	if(fullDate.ToString() != "D:19840403183045-02'00'")
	{
		status = PDFHummus::eFailure;
		cout<<"wrong string conversion for full date - "<<fullDate.ToString().c_str()<<"\n";
	}

	// Just display the current time as set by PDFDate
	PDFDate currentDate;
	currentDate.SetToCurrentTime();
	cout<<"Current time as represented in PDFDate - "<<currentDate.ToString().c_str()<<"\n";

	{
		// time structs
		time_t  time_local			= time(NULL);
		tm * my_utc_time			= gmtime(&time_local);
		my_utc_time->tm_isdst = -1; // automatic dst
		time_t time_utc				= mktime(my_utc_time);
		tm *my_local_time			= std::localtime(&time_local);
		int timezone_difference		= (long)(time_local - time_utc);
		
		// buffers/text
		const int strtime_buffsize = 1024;
		char strtime_buff[strtime_buffsize];
		string mytime;

		std::strftime(strtime_buff
			, strtime_buffsize
			, "D:%Y%m%d%H%M%S"
			, my_local_time);
		
		// PDF-style time representation. (It's just information)
		mytime = strtime_buff;
		mytime.append(timezone_difference >= 0 ? "+" : "-");
		sprintf(strtime_buff, "%02d'%02d'"
			, (int)(timezone_difference / 3600)
			, timezone_difference % 3600);
		mytime.append(strtime_buff);
		// padd "Current time as represented in PDFDate - "
		cout << "Current system time using time_t is    - " << mytime << "\n";

		// we can't test if it's UTC+0
		if (timezone_difference == 0){
			cout << " --> timezone test skipped as it's utc, you should change your timezone and try again. \n";
		}
		else{
			// calc timezone offset according to PDFHummus
			int PDFTimezone_diff = (currentDate.UTC == PDFDate::eEarlier ? -1 : 1)
				* ((currentDate.HourFromUTC * 3600) + currentDate.MinuteFromUTC * 60);
			
			// compare.
			if (PDFTimezone_diff != timezone_difference){
				status = PDFHummus::eFailure;
				cout << "timezone does not match!\n" <<
					" -> time_t    calculated: " << timezone_difference << " (secs from UTC)\n" <<
					" -> PDFHummus calculated: " << PDFTimezone_diff << "  (secs from UTC)\n";
			}

		}
	}



	return status == eSuccess ? 0:1;
}